

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SentenceFinderAdd(Fts5SFinder *p,int iAdd)

{
  int iVar1;
  void *pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  int *aNew;
  int nNew;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 4) == *(int *)(in_RDI + 8)) {
    if (*(int *)(in_RDI + 4) == 0) {
      iVar1 = 0x40;
    }
    else {
      iVar1 = *(int *)(in_RDI + 4) << 1;
    }
    pvVar2 = sqlite3_realloc64((void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0x28ef07);
    if (pvVar2 == (void *)0x0) {
      return 7;
    }
    *(void **)(in_RDI + 0x10) = pvVar2;
    *(int *)(in_RDI + 4) = iVar1;
  }
  iVar1 = *(int *)(in_RDI + 8);
  *(int *)(in_RDI + 8) = iVar1 + 1;
  *(undefined4 *)(*(long *)(in_RDI + 0x10) + (long)iVar1 * 4) = in_ESI;
  return 0;
}

Assistant:

static int fts5SentenceFinderAdd(Fts5SFinder *p, int iAdd){
  if( p->nFirstAlloc==p->nFirst ){
    int nNew = p->nFirstAlloc ? p->nFirstAlloc*2 : 64;
    int *aNew;

    aNew = (int*)sqlite3_realloc64(p->aFirst, nNew*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    p->aFirst = aNew;
    p->nFirstAlloc = nNew;
  }
  p->aFirst[p->nFirst++] = iAdd;
  return SQLITE_OK;
}